

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O3

CordRep * __thiscall
absl::lts_20250127::cord_internal::CordRepBtree::SubTree(CordRepBtree *this,size_t offset,size_t n)

{
  RefcountAndFlags *pRVar1;
  CordRep *pCVar2;
  uint8_t uVar3;
  uint uVar4;
  ulong uVar5;
  CordRepBtree *this_00;
  CordRepSubstring *pCVar6;
  CordRepBtree *pCVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  CordRepBtree *pCVar11;
  long lVar12;
  long lVar13;
  uint uVar14;
  ulong n_00;
  ulong uVar15;
  CopyResult CVar16;
  uint local_64;
  CordRepBtree *local_60;
  
  uVar9 = (this->super_CordRep).length;
  if (uVar9 < n) {
    __assert_fail("n <= this->length",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                  ,0x38a,"CordRep *absl::cord_internal::CordRepBtree::SubTree(size_t, size_t)");
  }
  if (uVar9 - n < offset) {
    __assert_fail("offset <= this->length - n",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                  ,0x38b,"CordRep *absl::cord_internal::CordRepBtree::SubTree(size_t, size_t)");
  }
  if (n == 0) {
    return (CordRep *)0x0;
  }
  if (uVar9 <= offset) {
LAB_0036c9b6:
    __assert_fail("offset < length",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                  ,0x329,
                  "CordRepBtree::Position absl::cord_internal::CordRepBtree::IndexOf(size_t) const")
    ;
  }
  uVar15 = (ulong)(this->super_CordRep).storage[1];
  this_00 = (CordRepBtree *)this->edges_[uVar15];
  uVar9 = (this_00->super_CordRep).length;
  if (uVar9 <= offset) {
    do {
      offset = offset - uVar9;
      this_00 = (CordRepBtree *)this->edges_[uVar15 + 1];
      uVar15 = uVar15 + 1;
      uVar9 = (this_00->super_CordRep).length;
    } while (uVar9 <= offset);
  }
  local_64 = (uint)(this->super_CordRep).storage[0];
  while (n_00 = offset + n, n_00 <= uVar9) {
    if ((int)local_64 < 1) {
      LOCK();
      pRVar1 = &(this_00->super_CordRep).refcount;
      (pRVar1->count_).super___atomic_base<int>._M_i =
           (pRVar1->count_).super___atomic_base<int>._M_i + 2;
      UNLOCK();
      if (uVar9 == n) {
        return &this_00->super_CordRep;
      }
      pCVar6 = anon_unknown_0::CreateSubstring(&this_00->super_CordRep,offset,n);
      return &pCVar6->super_CordRep;
    }
    if ((this_00->super_CordRep).tag != '\x03') goto LAB_0036c9d5;
    if (uVar9 <= offset) goto LAB_0036c9b6;
    uVar15 = (ulong)(this_00->super_CordRep).storage[1];
    pCVar7 = (CordRepBtree *)this_00->edges_[uVar15];
    uVar9 = (pCVar7->super_CordRep).length;
    if (uVar9 <= offset) {
      do {
        offset = offset - uVar9;
        pCVar7 = (CordRepBtree *)this_00->edges_[uVar15 + 1];
        uVar15 = uVar15 + 1;
        uVar9 = (pCVar7->super_CordRep).length;
      } while (uVar9 <= offset);
    }
    local_64 = local_64 - 1;
    this = this_00;
    this_00 = pCVar7;
  }
  if (uVar9 < n_00) {
    lVar13 = -8;
    lVar12 = 0;
    uVar5 = uVar9;
    do {
      n_00 = n_00 - uVar5;
      local_60 = *(CordRepBtree **)((long)this->edges_ + lVar13 + uVar15 * 8 + 0x10);
      uVar5 = (local_60->super_CordRep).length;
      lVar13 = lVar13 + 8;
      lVar12 = lVar12 + -1;
    } while (uVar5 < n_00);
    uVar5 = uVar15 - lVar12;
    if (uVar15 < uVar5) {
      if ((int)local_64 < 1) {
        LOCK();
        pRVar1 = &(this_00->super_CordRep).refcount;
        (pRVar1->count_).super___atomic_base<int>._M_i =
             (pRVar1->count_).super___atomic_base<int>._M_i + 2;
        UNLOCK();
        if (offset != 0) {
          this_00 = (CordRepBtree *)
                    anon_unknown_0::CreateSubstring(&this_00->super_CordRep,offset,uVar9 - offset);
        }
        LOCK();
        pRVar1 = &(local_60->super_CordRep).refcount;
        (pRVar1->count_).super___atomic_base<int>._M_i =
             (pRVar1->count_).super___atomic_base<int>._M_i + 2;
        UNLOCK();
        if ((local_60->super_CordRep).length != n_00) {
          if (n_00 == 0) {
            LOCK();
            pRVar1 = &(local_60->super_CordRep).refcount;
            uVar4 = (pRVar1->count_).super___atomic_base<int>._M_i;
            (pRVar1->count_).super___atomic_base<int>._M_i =
                 (pRVar1->count_).super___atomic_base<int>._M_i + -2;
            UNLOCK();
            if ((uVar4 & 1) == 0 && (int)uVar4 < 1) {
              __assert_fail("refcount > 0 || refcount & kImmortalFlag",
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_internal.h"
                            ,0xac,
                            "bool absl::cord_internal::RefcountAndFlags::DecrementExpectHighRefcount()"
                           );
            }
            if (uVar4 == 2) {
              CordRep::Destroy(&local_60->super_CordRep);
            }
            local_60 = (CordRepBtree *)0x0;
          }
          else {
            local_60 = (CordRepBtree *)
                       anon_unknown_0::CreateSubstring(&local_60->super_CordRep,0,n_00);
          }
        }
LAB_0036c8b8:
        pCVar7 = (CordRepBtree *)operator_new(0x40);
        (pCVar7->super_CordRep).refcount.count_.super___atomic_base<int>._M_i = 2;
        (pCVar7->super_CordRep).length = 0;
        (pCVar7->super_CordRep).tag = '\x03';
        (pCVar7->super_CordRep).storage[0] = (uint8_t)local_64;
        (pCVar7->super_CordRep).storage[1] = '\0';
        (pCVar7->super_CordRep).storage[2] = '\0';
        pCVar7->edges_[0] = &this_00->super_CordRep;
        if (uVar5 < uVar15 + 1) {
          __assert_fail("begin <= end",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                        ,0x277,
                        "absl::Span<CordRep *const> absl::cord_internal::CordRepBtree::Edges(size_t, size_t) const"
                       );
        }
        if ((ulong)(this->super_CordRep).storage[1] <= uVar15 + 1) {
          if ((this->super_CordRep).storage[2] < uVar5) {
            __assert_fail("end <= this->end()",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                          ,0x279,
                          "absl::Span<CordRep *const> absl::cord_internal::CordRepBtree::Edges(size_t, size_t) const"
                         );
          }
          if (lVar12 == -1) {
            lVar12 = 1;
          }
          else {
            lVar12 = 1;
            do {
              pCVar2 = this->edges_[uVar15 + lVar12];
              if (pCVar2 == (CordRep *)0x0) {
                __assert_fail("rep != nullptr",
                              "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_internal.h"
                              ,0x391,"static CordRep *absl::cord_internal::CordRep::Ref(CordRep *)")
                ;
              }
              LOCK();
              (pCVar2->refcount).count_.super___atomic_base<int>._M_i =
                   (pCVar2->refcount).count_.super___atomic_base<int>._M_i + 2;
              UNLOCK();
              pCVar7->edges_[lVar12] = pCVar2;
              lVar12 = lVar12 + 1;
              lVar13 = lVar13 + -8;
            } while (lVar13 != 0);
          }
          pCVar7->edges_[lVar12] = &local_60->super_CordRep;
          (pCVar7->super_CordRep).storage[2] = (char)lVar12 + '\x01';
          (pCVar7->super_CordRep).length = n;
          AssertValid(pCVar7,true);
          return &pCVar7->super_CordRep;
        }
        __assert_fail("begin >= this->begin()",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                      ,0x278,
                      "absl::Span<CordRep *const> absl::cord_internal::CordRepBtree::Edges(size_t, size_t) const"
                     );
      }
      if ((this_00->super_CordRep).tag == '\x03') {
        CVar16 = CopySuffix(this_00,offset);
        this_00 = (CordRepBtree *)CVar16.edge;
        if ((local_60->super_CordRep).tag == '\x03') {
          uVar8 = CVar16.height;
          CVar16 = CopyPrefix(local_60,n_00,true);
          pCVar7 = (CordRepBtree *)CVar16.edge;
          uVar14 = CVar16.height;
          uVar4 = uVar14;
          if ((int)uVar14 < (int)uVar8) {
            uVar4 = uVar8;
          }
          if (lVar12 == -1) {
            local_64 = uVar4 + 1;
          }
          if ((int)(uVar8 + 1) < (int)local_64) {
            iVar10 = ~uVar8 + local_64;
            pCVar11 = this_00;
            do {
              this_00 = (CordRepBtree *)operator_new(0x40);
              (this_00->super_CordRep).refcount.count_.super___atomic_base<int>._M_i = 2;
              if ((pCVar11->super_CordRep).tag == '\x03') {
                uVar3 = (pCVar11->super_CordRep).storage[0] + '\x01';
              }
              else {
                uVar3 = '\0';
              }
              (this_00->super_CordRep).length = (pCVar11->super_CordRep).length;
              (this_00->super_CordRep).tag = '\x03';
              (this_00->super_CordRep).storage[0] = uVar3;
              (this_00->super_CordRep).storage[1] = '\0';
              (this_00->super_CordRep).storage[2] = '\x01';
              this_00->edges_[0] = &pCVar11->super_CordRep;
              iVar10 = iVar10 + -1;
              pCVar11 = this_00;
            } while (iVar10 != 0);
          }
          uVar14 = uVar14 + 1;
          local_60 = pCVar7;
          if ((int)uVar14 < (int)local_64) {
            do {
              local_60 = (CordRepBtree *)operator_new(0x40);
              (local_60->super_CordRep).refcount.count_.super___atomic_base<int>._M_i = 2;
              if ((pCVar7->super_CordRep).tag == '\x03') {
                uVar3 = (pCVar7->super_CordRep).storage[0] + '\x01';
              }
              else {
                uVar3 = '\0';
              }
              (local_60->super_CordRep).length = (pCVar7->super_CordRep).length;
              (local_60->super_CordRep).tag = '\x03';
              (local_60->super_CordRep).storage[0] = uVar3;
              (local_60->super_CordRep).storage[1] = '\0';
              (local_60->super_CordRep).storage[2] = '\x01';
              local_60->edges_[0] = &pCVar7->super_CordRep;
              uVar14 = uVar14 + 1;
              pCVar7 = local_60;
            } while (local_64 != uVar14);
          }
          goto LAB_0036c8b8;
        }
      }
LAB_0036c9d5:
      __assert_fail("IsBtree()",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                    ,599,"CordRepBtree *absl::cord_internal::CordRep::btree()");
    }
  }
  __assert_fail("back.index > front.index",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                ,0x39b,"CordRep *absl::cord_internal::CordRepBtree::SubTree(size_t, size_t)");
}

Assistant:

CordRep* CordRepBtree::SubTree(size_t offset, size_t n) {
  assert(n <= this->length);
  assert(offset <= this->length - n);
  if (ABSL_PREDICT_FALSE(n == 0)) return nullptr;

  CordRepBtree* node = this;
  int height = node->height();
  Position front = node->IndexOf(offset);
  CordRep* left = node->edges_[front.index];
  while (front.n + n <= left->length) {
    if (--height < 0) return MakeSubstring(CordRep::Ref(left), front.n, n);
    node = left->btree();
    front = node->IndexOf(front.n);
    left = node->edges_[front.index];
  }

  const Position back = node->IndexBefore(front, n);
  CordRep* const right = node->edges_[back.index];
  assert(back.index > front.index);

  // Get partial suffix and prefix entries.
  CopyResult prefix;
  CopyResult suffix;
  if (height > 0) {
    // Copy prefix and suffix of the boundary nodes.
    prefix = left->btree()->CopySuffix(front.n);
    suffix = right->btree()->CopyPrefix(back.n);

    // If there is an edge between the prefix and suffix edges, then the tree
    // must remain at its previous (full) height. If we have no edges between
    // prefix and suffix edges, then the tree must be as high as either the
    // suffix or prefix edges (which are collapsed to their minimum heights).
    if (front.index + 1 == back.index) {
      height = (std::max)(prefix.height, suffix.height) + 1;
    }

    // Raise prefix and suffixes to the new tree height.
    for (int h = prefix.height + 1; h < height; ++h) {
      prefix.edge = CordRepBtree::New(prefix.edge);
    }
    for (int h = suffix.height + 1; h < height; ++h) {
      suffix.edge = CordRepBtree::New(suffix.edge);
    }
  } else {
    // Leaf node, simply take substrings for prefix and suffix.
    prefix = CopyResult{MakeSubstring(CordRep::Ref(left), front.n), -1};
    suffix = CopyResult{MakeSubstring(CordRep::Ref(right), 0, back.n), -1};
  }

  // Compose resulting tree.
  CordRepBtree* sub = CordRepBtree::New(height);
  size_t end = 0;
  sub->edges_[end++] = prefix.edge;
  for (CordRep* r : node->Edges(front.index + 1, back.index)) {
    sub->edges_[end++] = CordRep::Ref(r);
  }
  sub->edges_[end++] = suffix.edge;
  sub->set_end(end);
  sub->length = n;
  return AssertValid(sub);
}